

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPath.c
# Opt level: O0

char * sbfPath_get(char *fmt,...)

{
  char *pcVar1;
  char *in_RDX;
  __va_list_tag *in_RSI;
  char *path;
  va_list ap;
  
  pcVar1 = sbfPath_getV(in_RDX,in_RSI);
  return pcVar1;
}

Assistant:

char*
sbfPath_get (const char* fmt, ...)
{
    va_list ap;
    char*   path;

    va_start (ap, fmt);
    path = sbfPath_getV (fmt, ap);
    va_end (ap);

    return path;
}